

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

void __thiscall backend::codegen::Codegen::add_collapsed_var(Codegen *this,VarId *tgt,VarId *item)

{
  pair<std::__detail::_Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>,_bool>
  pVar1;
  VarId tgt_src;
  VarId item_src;
  undefined1 local_60 [48];
  undefined **local_30;
  _Rb_tree_color local_28;
  
  local_30 = &PTR_display_001ee058;
  local_28 = tgt->id;
  get_collapsed_var((Codegen *)local_60,(VarId *)this);
  local_60._16_8_ = &PTR_display_001ee058;
  local_60._24_4_ = item->id;
  get_collapsed_var((Codegen *)(local_60 + 0x20),(VarId *)this);
  pVar1 = std::__detail::
          _Insert_base<mir::inst::VarId,std::pair<mir::inst::VarId_const,mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,mir::inst::VarId>>,std::__detail::_Select1st,std::equal_to<mir::inst::VarId>,std::hash<mir::inst::VarId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::try_emplace<mir::inst::VarId_const&,mir::inst::VarId&>
                    ((_Insert_base<mir::inst::VarId,std::pair<mir::inst::VarId_const,mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,mir::inst::VarId>>,std::__detail::_Select1st,std::equal_to<mir::inst::VarId>,std::hash<mir::inst::VarId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&this->var_collapse,(const_iterator)0x0,(VarId *)(local_60 + 0x20),
                     (VarId *)local_60);
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    *(undefined4 *)
     ((long)pVar1.first.
            super__Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>.
            _M_cur.
            super__Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true> +
     0x20) = local_60._8_4_;
  }
  return;
}

Assistant:

void Codegen::add_collapsed_var(mir::inst::VarId tgt, mir::inst::VarId item) {
  auto tgt_src = get_collapsed_var(tgt);
  auto item_src = get_collapsed_var(item);

  var_collapse.insert_or_assign(item_src, tgt_src);
}